

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

bool __thiscall QPDFObjectHandle::getBoolValue(QPDFObjectHandle *this)

{
  allocator<char> local_41;
  string local_40;
  QPDF_Bool *local_20;
  QPDF_Bool *boolean;
  QPDFObjectHandle *this_local;
  
  boolean = (QPDF_Bool *)this;
  local_20 = ::qpdf::BaseHandle::as<QPDF_Bool>(&this->super_BaseHandle);
  if (local_20 == (QPDF_Bool *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"returning false",&local_41);
    typeWarning(this,"boolean",&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    QTC::TC("qpdf","QPDFObjectHandle boolean returning false",0);
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = (bool)(local_20->val & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool
QPDFObjectHandle::getBoolValue() const
{
    if (auto boolean = as<QPDF_Bool>()) {
        return boolean->val;
    } else {
        typeWarning("boolean", "returning false");
        QTC::TC("qpdf", "QPDFObjectHandle boolean returning false");
        return false;
    }
}